

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_TestFailure_UnsignedLongLongsEqualFailure_TestShell::createTest
          (TEST_TestFailure_UnsignedLongLongsEqualFailure_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x10,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
                                  ,0x9a);
  this_00->_vptr_Utest = (_func_int **)0x0;
  this_00[1]._vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_00355a48;
  return this_00;
}

Assistant:

TEST(TestFailure, UnsignedLongLongsEqualFailure)
{
#if CPPUTEST_USE_LONG_LONG
    UnsignedLongLongsEqualFailure f(test, failFileName, failLineNumber, 1, 2, "");
    FAILURE_EQUAL("expected <1 (0x1)>\n\tbut was  <2 (0x2)>", f);
#else
    cpputest_ulonglong dummy_ulonglong;
    UnsignedLongLongsEqualFailure f(test, failFileName, failLineNumber, dummy_ulonglong, dummy_ulonglong, "");
    FAILURE_EQUAL("expected <<ulonglong_unsupported> >\n\tbut was  <<ulonglong_unsupported> >", f);
#endif
}